

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O1

UBool __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::operator==
          (LocalizedNumberFormatterAsFormat *this,Format *other)

{
  UBool UVar1;
  long lVar2;
  bool bVar3;
  UErrorCode localStatus;
  UErrorCode local_a4;
  UnicodeString local_a0;
  UnicodeString local_60;
  
  bVar3 = false;
  lVar2 = __dynamic_cast(other,&Format::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    local_a4 = U_ZERO_ERROR;
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_60,
               &(this->fFormatter).
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>,&local_a4);
    NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::toSkeleton
              (&local_a0,
               (NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *)(lVar2 + 0x148),
               &local_a4);
    if ((local_60.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
        local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (-1 < local_a0.fUnion.fStackFields.fLengthAndFlags) {
        local_a0.fUnion.fFields.fLength = (int)local_a0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      bVar3 = false;
      if ((((int)local_a0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
         (bVar3 = false, local_60.fUnion.fFields.fLength == local_a0.fUnion.fFields.fLength)) {
        UVar1 = UnicodeString::doEquals(&local_60,&local_a0,local_60.fUnion.fFields.fLength);
        bVar3 = UVar1 != '\0';
      }
    }
    else {
      bVar3 = (bool)(local_a0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
    }
    UnicodeString::~UnicodeString(&local_a0);
    UnicodeString::~UnicodeString(&local_60);
  }
  return bVar3;
}

Assistant:

UBool LocalizedNumberFormatterAsFormat::operator==(const Format& other) const {
    auto* _other = dynamic_cast<const LocalizedNumberFormatterAsFormat*>(&other);
    if (_other == nullptr) {
        return false;
    }
    // TODO: Change this to use LocalizedNumberFormatter::operator== if it is ever proposed.
    // This implementation is fine, but not particularly efficient.
    UErrorCode localStatus = U_ZERO_ERROR;
    return fFormatter.toSkeleton(localStatus) == _other->fFormatter.toSkeleton(localStatus);
}